

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_setupvalf(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  UpVal *pUVar1;
  TValue *pTVar2;
  TValue *io;
  UpVal *uv;
  lua_Number na;
  int b_local;
  TValue *ra_local;
  LClosure *cl_local;
  lua_State *L_local;
  
  if (ra->tt_ == 3) {
    if (ra->tt_ != 3) {
      __assert_fail("((((ra))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbb1,"void raviV_op_setupvalf(lua_State *, LClosure *, TValue *, int)");
    }
    uv = (UpVal *)(ra->value_).gc;
  }
  else {
    if (ra->tt_ != 0x13) {
      luaG_runerror(L,"upvalue of number type, cannot be set to non number value");
    }
    if (ra->tt_ != 0x13) {
      __assert_fail("((((ra))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbb1,"void raviV_op_setupvalf(lua_State *, LClosure *, TValue *, int)");
    }
    uv = (UpVal *)(double)(ra->value_).i;
  }
  pUVar1 = cl->upvals[b];
  pTVar2 = pUVar1->v;
  (pTVar2->value_).gc = (GCObject *)uv;
  pTVar2->tt_ = 3;
  if (((ra->tt_ & 0x8000) != 0) && (pUVar1->v == (TValue *)&pUVar1->u)) {
    if ((ra->tt_ & 0x8000) == 0) {
      __assert_fail("(((ra)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbb4,"void raviV_op_setupvalf(lua_State *, LClosure *, TValue *, int)");
    }
    luaC_upvalbarrier_(L,(ra->value_).gc);
  }
  return;
}

Assistant:

void raviV_op_setupvalf(lua_State *L, LClosure *cl, TValue *ra, int b) {
  lua_Number na;
  if (tonumberns(ra, na)) {
    UpVal *uv = cl->upvals[b];
    setfltvalue(uv->v, na);
    luaC_upvalbarrier(L, uv, ra);
  }
  else
    luaG_runerror(L,
                  "upvalue of number type, cannot be set to non number value");
}